

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_hashtable_insert(arg_hashtable_t *h,void *k,void *v)

{
  uint uVar1;
  arg_hashtable_entry *paVar2;
  arg_hashtable_entry *e;
  uint index;
  void *v_local;
  void *k_local;
  arg_hashtable_t *h_local;
  
  if (h->loadlimit < h->entrycount + 1) {
    arg_hashtable_expand(h);
  }
  paVar2 = (arg_hashtable_entry *)argtable3_xmalloc(0x20);
  uVar1 = enhanced_hash(h,k);
  paVar2->h = uVar1;
  uVar1 = index_for(h->tablelength,paVar2->h);
  paVar2->k = k;
  paVar2->v = v;
  paVar2->next = h->table[uVar1];
  h->table[uVar1] = paVar2;
  h->entrycount = h->entrycount + 1;
  return;
}

Assistant:

void arg_hashtable_insert(arg_hashtable_t* h, void* k, void* v) {
    /* This method allows duplicate keys - but they shouldn't be used */
    unsigned int index;
    struct arg_hashtable_entry* e;
    if ((h->entrycount + 1) > h->loadlimit) {
        /*
         * Ignore the return value. If expand fails, we should
         * still try cramming just this value into the existing table
         * -- we may not have memory for a larger table, but one more
         * element may be ok. Next time we insert, we'll try expanding again.
         */
        arg_hashtable_expand(h);
    }
    e = (struct arg_hashtable_entry*)xmalloc(sizeof(struct arg_hashtable_entry));
    e->h = enhanced_hash(h, k);
    index = index_for(h->tablelength, e->h);
    e->k = k;
    e->v = v;
    e->next = h->table[index];
    h->table[index] = e;
    h->entrycount++;
}